

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O0

void pfx_table_for_each_rec(trie_node *n,pfx_for_each_fp fp,void *data)

{
  uint *puVar1;
  long in_FS_OFFSET;
  uint local_5c;
  uint i;
  node_data *nd;
  void *data_local;
  pfx_for_each_fp fp_local;
  trie_node *n_local;
  pfx_record pfxr;
  
  pfxr.socket = *(rtr_socket **)(in_FS_OFFSET + 0x28);
  if (n == (trie_node *)0x0) {
    __assert_fail("n",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                  ,0x20b,"void pfx_table_for_each_rec(struct trie_node *, pfx_for_each_fp, void *)")
    ;
  }
  if (fp == (pfx_for_each_fp)0x0) {
    __assert_fail("fp",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                  ,0x20c,"void pfx_table_for_each_rec(struct trie_node *, pfx_for_each_fp, void *)")
    ;
  }
  puVar1 = (uint *)n->data;
  if (puVar1 == (uint *)0x0) {
    __assert_fail("nd",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                  ,0x20f,"void pfx_table_for_each_rec(struct trie_node *, pfx_for_each_fp, void *)")
    ;
  }
  if (n->lchild != (trie_node *)0x0) {
    pfx_table_for_each_rec(n->lchild,fp,data);
  }
  for (local_5c = 0; local_5c < *puVar1; local_5c = local_5c + 1) {
    n_local._0_4_ = *(undefined4 *)(*(long *)(puVar1 + 2) + (ulong)local_5c * 0x10);
    unique0x00012000 = *(undefined8 *)&n->prefix;
    pfxr.prefix._0_8_ = *(undefined8 *)((long)&(n->prefix).u + 4);
    pfxr.prefix.u.addr6.addr[1] = (n->prefix).u.addr6.addr[3];
    pfxr.prefix.u.addr6.addr[2]._0_1_ = n->len;
    pfxr.prefix.u.addr6.addr[2]._1_1_ =
         *(undefined1 *)(*(long *)(puVar1 + 2) + (ulong)local_5c * 0x10 + 4);
    pfxr._24_8_ = *(undefined8 *)(*(long *)(puVar1 + 2) + (ulong)local_5c * 0x10 + 8);
    (*fp)((pfx_record *)&n_local,data);
  }
  if (n->rchild != (trie_node *)0x0) {
    pfx_table_for_each_rec(n->rchild,fp,data);
  }
  if (*(rtr_socket **)(in_FS_OFFSET + 0x28) == pfxr.socket) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void pfx_table_for_each_rec(struct trie_node *n, pfx_for_each_fp fp, void *data)
{
	struct pfx_record pfxr;
	struct node_data *nd;

	assert(n);
	assert(fp);

	nd = (struct node_data *)n->data;
	assert(nd);

	if (n->lchild)
		pfx_table_for_each_rec(n->lchild, fp, data);

	for (unsigned int i = 0; i < nd->len; i++) {
		pfxr.asn = nd->ary[i].asn;
		pfxr.prefix = n->prefix;
		pfxr.min_len = n->len;
		pfxr.max_len = nd->ary[i].max_len;
		pfxr.socket = nd->ary[i].socket;
		fp(&pfxr, data);
	}

	if (n->rchild)
		pfx_table_for_each_rec(n->rchild, fp, data);
}